

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O1

string * __thiscall
cmCTestHG::GetWorkingRevision_abi_cxx11_(string *__return_storage_ptr__,cmCTestHG *this)

{
  char *hg_identify [4];
  OutputLogger err;
  IdentifyParser out;
  pointer local_198;
  char *local_190;
  char *local_188;
  undefined8 local_180;
  OutputLogger local_170;
  IdentifyParser local_130;
  
  local_198 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  local_190 = "identify";
  local_188 = "-i";
  local_180 = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  IdentifyParser::IdentifyParser(&local_130,this,"rev-out> ",__return_storage_ptr__);
  cmProcessTools::OutputLogger::OutputLogger
            (&local_170,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"rev-err> ");
  cmCTestVC::RunChild((cmCTestVC *)this,&local_198,(OutputParser *)&local_130,
                      (OutputParser *)&local_170,(char *)0x0);
  local_170.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_006bc790;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.super_LineParser.Line._M_dataplus._M_p !=
      &local_170.super_LineParser.Line.field_2) {
    operator_delete(local_170.super_LineParser.Line._M_dataplus._M_p,
                    local_170.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_130.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__IdentifyParser_006bb020;
  if (local_130.RegexIdentify.program != (char *)0x0) {
    operator_delete__(local_130.RegexIdentify.program);
  }
  local_130.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_006bc790;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.super_LineParser.Line._M_dataplus._M_p !=
      &local_130.super_LineParser.Line.field_2) {
    operator_delete(local_130.super_LineParser.Line._M_dataplus._M_p,
                    local_130.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestHG::GetWorkingRevision()
{
  // Run plumbing "hg identify" to get work tree revision.
  const char* hg = this->CommandLineTool.c_str();
  const char* hg_identify[] = {hg, "identify","-i", 0};
  std::string rev;
  IdentifyParser out(this, "rev-out> ", rev);
  OutputLogger err(this->Log, "rev-err> ");
  this->RunChild(hg_identify, &out, &err);
  return rev;
}